

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

SSTableIndex * __thiscall SSTable::getIndex(SSTable *this)

{
  vector<SSTableIndexItem,std::allocator<SSTableIndexItem>> *this_00;
  iterator __position;
  SSTableHeader *pSVar1;
  SSTableIndex *pSVar2;
  SSTableIndexItem temp;
  ifstream in;
  SSTableIndexItem local_238;
  long local_228 [4];
  byte abStack_208 [488];
  
  if (this->index == (SSTableIndex *)0x0) {
    pSVar1 = getHeader(this);
    std::ifstream::ifstream(local_228,(this->file)._M_pathname._M_dataplus._M_p,_S_in|_S_bin);
    std::istream::seekg(local_228,pSVar1->index_offset,0);
    pSVar2 = (SSTableIndex *)operator_new(0x18);
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->index = pSVar2;
    local_238.key = 0;
    local_238.offset = 0;
    while( true ) {
      std::istream::read((char *)local_228,(long)&local_238);
      std::istream::read((char *)local_228,(long)&local_238.offset);
      if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) != 0) break;
      this_00 = (vector<SSTableIndexItem,std::allocator<SSTableIndexItem>> *)this->index;
      __position._M_current = *(SSTableIndexItem **)(this_00 + 8);
      if (__position._M_current == *(SSTableIndexItem **)(this_00 + 0x10)) {
        std::vector<SSTableIndexItem,std::allocator<SSTableIndexItem>>::
        _M_realloc_insert<SSTableIndexItem_const&>(this_00,__position,&local_238);
      }
      else {
        (__position._M_current)->key = local_238.key;
        (__position._M_current)->offset = local_238.offset;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
    }
    std::ifstream::~ifstream(local_228);
  }
  return this->index;
}

Assistant:

SSTableIndex *SSTable::getIndex() {
    if (index == nullptr) {
        auto *h = getHeader();
        auto in = create_binary_ifstream(file);
        in.seekg(h->index_offset);
        index = new SSTableIndex{};
        auto temp = SSTableIndexItem{};
        while (in >> temp) {
            index->push_back(temp);
        }
    }
    return index;
}